

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O2

int64 floatx80_to_int64(floatx80 a)

{
  int64 iVar1;
  ushort uVar2;
  bits64 aSig;
  bits64 aSigExtra;
  bits64 local_28;
  bits64 local_20;
  
  local_28 = a.low;
  uVar2 = a.high & 0x7fff;
  if (uVar2 < 0x403e) {
    shift64ExtraRightJamming(local_28,0,0x403e - uVar2,&local_28,&local_20);
  }
  else {
    if (uVar2 != 0x403e) {
      float_exception_flags = float_exception_flags | 1;
      iVar1 = 0x7fffffffffffffff;
      if ((short)a.high < 0) {
        if (local_28 == 0x8000000000000000) {
          iVar1 = -0x8000000000000000;
        }
        if (uVar2 != 0x7fff) {
          iVar1 = -0x8000000000000000;
        }
      }
      return iVar1;
    }
    local_20 = 0;
  }
  iVar1 = roundAndPackInt64((flag)((a._0_8_ & 0xffff) >> 0xf),local_28,local_20);
  return iVar1;
}

Assistant:

int64 floatx80_to_int64( floatx80 a )
{
	flag aSign;
	int32 aExp, shiftCount;
	bits64 aSig, aSigExtra;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	aSign = extractFloatx80Sign( a );
	shiftCount = 0x403E - aExp;
	if ( shiftCount <= 0 ) {
		if ( shiftCount ) {
			float_raise( float_flag_invalid );
			if (    ! aSign
					|| (    ( aExp == 0x7FFF )
						&& ( aSig != LIT64( 0x8000000000000000 ) ) )
				) {
				return LIT64( 0x7FFFFFFFFFFFFFFF );
			}
			return (sbits64) LIT64( 0x8000000000000000 );
		}
		aSigExtra = 0;
	}
	else {
		shift64ExtraRightJamming( aSig, 0, shiftCount, &aSig, &aSigExtra );
	}
	return roundAndPackInt64( aSign, aSig, aSigExtra );

}